

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_handle.cpp
# Opt level: O3

string * __thiscall
duckdb::CSVFileHandle::ReadLine_abi_cxx11_(string *__return_storage_ptr__,CSVFileHandle *this)

{
  byte bVar1;
  bool bVar2;
  idx_t iVar3;
  pointer pFVar4;
  pointer this_00;
  BinderException *this_01;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *this_02;
  char buffer [1];
  char local_51;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = 0;
  while( true ) {
    iVar3 = Read(this,&local_51,1);
    if (iVar3 == 0) {
      return __return_storage_ptr__;
    }
    if ((bool)(local_51 != '\n' & bVar1)) break;
    if (local_51 == '\n') {
      return __return_storage_ptr__;
    }
    if (local_51 == '\r') {
      bVar1 = 1;
    }
    else {
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  this_02 = &this->file_handle;
  pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (this_02);
  bVar2 = FileHandle::CanSeek(pFVar4);
  if (bVar2) {
    pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->(this_02);
    this_00 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
              operator->(this_02);
    iVar3 = FileHandle::SeekPosition(this_00);
    FileHandle::Seek(pFVar4,iVar3 - 1);
    return __return_storage_ptr__;
  }
  this_01 = (BinderException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Carriage return newlines not supported when reading CSV files in which we cannot seek"
             ,"");
  BinderException::BinderException(this_01,&local_50);
  __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string CSVFileHandle::ReadLine() {
	bool carriage_return = false;
	string result;
	char buffer[1];
	while (true) {
		idx_t bytes_read = Read(buffer, 1);
		if (bytes_read == 0) {
			return result;
		}
		if (carriage_return) {
			if (buffer[0] != '\n') {
				if (!file_handle->CanSeek()) {
					throw BinderException(
					    "Carriage return newlines not supported when reading CSV files in which we cannot seek");
				}
				file_handle->Seek(file_handle->SeekPosition() - 1);
				return result;
			}
		}
		if (buffer[0] == '\n') {
			return result;
		}
		if (buffer[0] != '\r') {
			result += buffer[0];
		} else {
			carriage_return = true;
		}
	}
}